

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int cbs_get_length_prefixed(CBS *cbs,CBS *out,size_t len_len)

{
  ulong uVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar1 = cbs->len;
  uVar4 = uVar1 - len_len;
  if (len_len <= uVar1) {
    puVar2 = cbs->data;
    cbs->data = puVar2 + len_len;
    cbs->len = uVar4;
    if (len_len == 0) {
      uVar4 = 0;
    }
    else {
      sVar5 = 0;
      uVar4 = 0;
      do {
        uVar4 = uVar4 << 8 | (ulong)puVar2[sVar5];
        sVar5 = sVar5 + 1;
      } while (len_len != sVar5);
    }
  }
  iVar3 = 0;
  if ((len_len <= uVar1) && (uVar4 <= cbs->len)) {
    puVar2 = cbs->data;
    cbs->data = puVar2 + uVar4;
    cbs->len = cbs->len - uVar4;
    out->data = puVar2;
    out->len = uVar4;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}